

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O1

void ly_err_free(void *ptr)

{
  void *pvVar1;
  
  while (ptr != (void *)0x0) {
    pvVar1 = *(void **)((long)ptr + 0x38);
    free(*(void **)((long)ptr + 0x10));
    free(*(void **)((long)ptr + 0x18));
    free(*(void **)((long)ptr + 0x20));
    free(*(void **)((long)ptr + 0x30));
    free(ptr);
    ptr = pvVar1;
  }
  return;
}

Assistant:

LIBYANG_API_DEF void
ly_err_free(void *ptr)
{
    struct ly_err_item *e, *next;

    /* clean the error list */
    LY_LIST_FOR_SAFE(ptr, next, e) {
        free(e->msg);
        free(e->data_path);
        free(e->schema_path);
        free(e->apptag);
        free(e);
    }
}